

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_ln.c
# Opt level: O2

void cmd_ln_appl_enter(int argc,char **argv,char *default_argfn,arg_t *defn)

{
  int iVar1;
  int32 iVar2;
  FILE *__stream;
  char *__s1;
  
  if (argc == 1) {
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/cmd_ln.c"
            ,0x205,"Looking for default argument file: %s\n",default_argfn);
    __stream = fopen(default_argfn,"r");
    if (__stream == (FILE *)0x0) {
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/cmd_ln.c"
              ,0x209,"Can\'t find default argument file %s.\n",default_argfn);
LAB_00106fba:
      cmd_ln_parse(defn,argc,argv,1);
      return;
    }
    fclose(__stream);
    __s1 = default_argfn;
    if (default_argfn == (char *)0x0) goto LAB_00106fba;
  }
  else {
    if (argc != 2) goto LAB_00106fba;
    __s1 = argv[1];
    iVar1 = strcmp(__s1,"help");
    if (iVar1 == 0) goto LAB_0010701a;
    if (*__s1 == '-') goto LAB_00106fba;
  }
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/cmd_ln.c"
          ,0x215,"Parsing command lines from file %s\n",__s1);
  iVar2 = cmd_ln_parse_file(defn,__s1,1);
  if (iVar2 == 0) {
    return;
  }
  err_msg(ERR_INFOCONT,(char *)0x0,0,"Usage:\n");
  err_msg(ERR_INFOCONT,(char *)0x0,0,"\t%s argument-list, or\n",*argv);
  err_msg(ERR_INFOCONT,(char *)0x0,0,"\t%s [argument-file] (default file: . %s)\n\n",*argv,
          default_argfn);
LAB_0010701a:
  cmd_ln_print_help_r(global_cmdln,_stderr,defn);
  exit(1);
}

Assistant:

void
cmd_ln_appl_enter(int argc, char *argv[],
                  const char *default_argfn,
                  const arg_t * defn)
{
    /* Look for default or specified arguments file */
    const char *str;

    str = NULL;

    if ((argc == 2) && (strcmp(argv[1], "help") == 0)) {
        cmd_ln_print_help(stderr, defn);
        exit(1);
    }

    if ((argc == 2) && (argv[1][0] != '-'))
        str = argv[1];
    else if (argc == 1) {
        FILE *fp;
        E_INFO("Looking for default argument file: %s\n", default_argfn);

        if ((fp = fopen(default_argfn, "r")) == NULL) {
            E_INFO("Can't find default argument file %s.\n",
                   default_argfn);
        }
        else {
            str = default_argfn;
        }
        if (fp != NULL)
            fclose(fp);
    }


    if (str) {
        /* Build command line argument list from file */
        E_INFO("Parsing command lines from file %s\n", str);
        if (cmd_ln_parse_file(defn, str, TRUE)) {
            E_INFOCONT("Usage:\n");
            E_INFOCONT("\t%s argument-list, or\n", argv[0]);
            E_INFOCONT("\t%s [argument-file] (default file: . %s)\n\n",
                    argv[0], default_argfn);
            cmd_ln_print_help(stderr, defn);
            exit(1);
        }
    }
    else {
        cmd_ln_parse(defn, argc, argv, TRUE);
    }
}